

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseMessageSetItem
          (ExtensionSet *this,CodedInputStream *input,ExtensionFinder *extension_finder,
          MessageSetFieldSkipper *field_skipper)

{
  byte *pbVar1;
  char cVar2;
  bool bVar3;
  uint first_byte_or_zero;
  int iVar4;
  int field_number;
  uint32 length;
  string temp;
  uint32 uStack_b0;
  string message_data;
  CodedOutputStream coded_output;
  StringOutputStream output_stream;
  
  message_data._M_dataplus._M_p = (pointer)&message_data.field_2;
  message_data._M_string_length = 0;
  message_data.field_2._M_local_buf[0] = '\0';
  field_number = 0;
LAB_00311264:
  do {
    pbVar1 = input->buffer_;
    if (pbVar1 < input->buffer_end_) {
      first_byte_or_zero = (uint)*pbVar1;
      if ((char)*pbVar1 < '\0') goto LAB_0031127e;
      input->buffer_ = pbVar1 + 1;
    }
    else {
      first_byte_or_zero = 0;
LAB_0031127e:
      first_byte_or_zero = io::CodedInputStream::ReadTagFallback(input,first_byte_or_zero);
    }
    if (first_byte_or_zero == 0x1a) {
      if (field_number == 0) {
        temp._M_dataplus._M_p = (pointer)&temp.field_2;
        temp._M_string_length = 0;
        temp.field_2._M_allocated_capacity = temp.field_2._M_allocated_capacity & 0xffffffffffffff00
        ;
        bVar3 = io::CodedInputStream::ReadVarint32(input,&length);
        if ((!bVar3) || (bVar3 = io::CodedInputStream::ReadString(input,&temp,length), !bVar3)) {
          std::__cxx11::string::~string((string *)&temp);
          goto LAB_0031145f;
        }
        io::StringOutputStream::StringOutputStream(&output_stream,&message_data);
        io::CodedOutputStream::CodedOutputStream
                  (&coded_output,&output_stream.super_ZeroCopyOutputStream);
        io::CodedOutputStream::WriteVarint32(&coded_output,length);
        io::CodedOutputStream::WriteString(&coded_output,&temp);
        io::CodedOutputStream::~CodedOutputStream(&coded_output);
        io::StringOutputStream::~StringOutputStream(&output_stream);
        std::__cxx11::string::~string((string *)&temp);
        field_number = 0;
        goto LAB_00311264;
      }
      cVar2 = ParseFieldMaybeLazily(this,2,field_number,input,extension_finder,field_skipper);
    }
    else {
      if (first_byte_or_zero == 0) goto LAB_0031145f;
      if (first_byte_or_zero == 0xc) {
        bVar3 = true;
        goto LAB_00311461;
      }
      if (first_byte_or_zero == 0x10) {
        bVar3 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&coded_output);
        field_number = (int)coded_output.output_;
        if (!bVar3) goto LAB_0031145f;
        if (message_data._M_string_length != 0) {
          temp._M_dataplus = message_data._M_dataplus;
          temp.field_2._8_4_ = (undefined4)message_data._M_string_length;
          temp._M_string_length =
               (size_type)(message_data._M_dataplus._M_p + (int)temp.field_2._8_4_);
          temp.field_2._M_allocated_capacity = 0;
          temp.field_2._12_4_ = 0;
          uStack_b0 = 0;
          bVar3 = ParseFieldMaybeLazily
                            (this,2,(int)coded_output.output_,(CodedInputStream *)&temp,
                             extension_finder,field_skipper);
          if (!bVar3) {
            io::CodedInputStream::~CodedInputStream((CodedInputStream *)&temp);
            goto LAB_0031145f;
          }
          message_data._M_string_length = 0;
          *message_data._M_dataplus._M_p = '\0';
          io::CodedInputStream::~CodedInputStream((CodedInputStream *)&temp);
        }
        goto LAB_00311264;
      }
      iVar4 = (*(field_skipper->super_UnknownFieldSetFieldSkipper).super_FieldSkipper.
                _vptr_FieldSkipper[2])(field_skipper,input,(ulong)first_byte_or_zero);
      cVar2 = (char)iVar4;
    }
    if (cVar2 == '\0') {
LAB_0031145f:
      bVar3 = false;
LAB_00311461:
      std::__cxx11::string::~string((string *)&message_data);
      return bVar3;
    }
  } while( true );
}

Assistant:

bool ExtensionSet::ParseMessageSetItem(io::CodedInputStream* input,
                                       ExtensionFinder* extension_finder,
                                       MessageSetFieldSkipper* field_skipper) {
  // TODO(kenton):  It would be nice to share code between this and
  // WireFormatLite::ParseAndMergeMessageSetItem(), but I think the
  // differences would be hard to factor out.

  // This method parses a group which should contain two fields:
  //   required int32 type_id = 2;
  //   required data message = 3;

  uint32 last_type_id = 0;

  // If we see message data before the type_id, we'll append it to this so
  // we can parse it later.
  string message_data;

  while (true) {
    const uint32 tag = input->ReadTagNoLastTag();
    if (tag == 0) return false;

    switch (tag) {
      case WireFormatLite::kMessageSetTypeIdTag: {
        uint32 type_id;
        if (!input->ReadVarint32(&type_id)) return false;
        last_type_id = type_id;

        if (!message_data.empty()) {
          // We saw some message data before the type_id.  Have to parse it
          // now.
          io::CodedInputStream sub_input(
              reinterpret_cast<const uint8*>(message_data.data()),
              message_data.size());
          if (!ParseFieldMaybeLazily(WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
                                     last_type_id, &sub_input,
                                     extension_finder, field_skipper)) {
            return false;
          }
          message_data.clear();
        }

        break;
      }

      case WireFormatLite::kMessageSetMessageTag: {
        if (last_type_id == 0) {
          // We haven't seen a type_id yet.  Append this data to message_data.
          string temp;
          uint32 length;
          if (!input->ReadVarint32(&length)) return false;
          if (!input->ReadString(&temp, length)) return false;
          io::StringOutputStream output_stream(&message_data);
          io::CodedOutputStream coded_output(&output_stream);
          coded_output.WriteVarint32(length);
          coded_output.WriteString(temp);
        } else {
          // Already saw type_id, so we can parse this directly.
          if (!ParseFieldMaybeLazily(WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
                                     last_type_id, input,
                                     extension_finder, field_skipper)) {
            return false;
          }
        }

        break;
      }

      case WireFormatLite::kMessageSetItemEndTag: {
        return true;
      }

      default: {
        if (!field_skipper->SkipField(input, tag)) return false;
      }
    }
  }
}